

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMoveToSr<(moira::Instr)75,(moira::Mode)9,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 data;
  u32 ea;
  
  if ((this->reg).sr.s != false) {
    bVar1 = readOp<(moira::Mode)9,(moira::Size)2,128ul>(this,opcode & 7,&ea,&data);
    if (bVar1) {
      (*this->_vptr_Moira[0x19])(this,4);
      setSR(this,(u16)data);
      readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,(this->reg).pc + 2);
      prefetch<4ul>(this);
    }
    return;
  }
  execPrivilegeException(this);
  return;
}

Assistant:

void
Moira::execMoveToSr(u16 opcode)
{
    SUPERVISOR_MODE_ONLY

    int src = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;

    sync(4);
    setSR(data);

    (void)readM <MEM_PROG, Word> (reg.pc + 2);
    prefetch<POLLIPL>();
}